

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModel.cpp
# Opt level: O0

void __thiscall FMB::FiniteModel::FiniteModel(FiniteModel *this,uint size)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  __type_conflict _Var4;
  uint add_1;
  uint arity_1;
  uint p;
  uint add;
  uint arity;
  uint f;
  uint offsets;
  int in_stack_ffffffffffffff0c;
  Signature *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  DArray<unsigned_int> *in_stack_ffffffffffffff20;
  uint defVal;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  DArray<unsigned_int> *in_stack_ffffffffffffff38;
  uint local_30;
  uint local_24;
  uint local_20;
  
  *in_RDI = in_ESI;
  *(undefined1 *)(in_RDI + 1) = 0;
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
            ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)(in_RDI + 2))
  ;
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
            ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             (in_RDI + 0xc));
  Lib::DArray<unsigned_int>::DArray
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
            );
  Lib::DArray<unsigned_int>::DArray
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
            );
  Lib::DArray<unsigned_int>::DArray
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
            );
  Lib::DArray<unsigned_int>::DArray
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
            );
  Lib::DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
            ((DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             (in_RDI + 0x2e));
  Lib::DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
            ((DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             (in_RDI + 0x38));
  Kernel::Signature::functions((Signature *)0x2b147b);
  Lib::DArray<unsigned_int>::ensure
            (in_stack_ffffffffffffff38,CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
            );
  Kernel::Signature::predicates((Signature *)0x2b14b6);
  Lib::DArray<unsigned_int>::ensure
            (in_stack_ffffffffffffff38,CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
            );
  local_20 = 1;
  local_24 = 0;
  while( true ) {
    uVar1 = Kernel::Signature::functions((Signature *)0x2b1501);
    if (uVar1 <= local_24) break;
    Kernel::Signature::functionArity(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    puVar3 = Lib::DArray<unsigned_int>::operator[]
                       ((DArray<unsigned_int> *)(in_RDI + 0x16),(ulong)local_24);
    *puVar3 = local_20;
    _Var4 = std::pow<unsigned_int,unsigned_int>(0,0x2b158b);
    local_20 = (int)(long)_Var4 + local_20;
    local_24 = local_24 + 1;
  }
  Lib::DArray<unsigned_int>::expand
            ((DArray<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  local_20 = 1;
  local_30 = 1;
  while( true ) {
    defVal = (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    uVar1 = local_30;
    uVar2 = Kernel::Signature::predicates((Signature *)0x2b16f6);
    if (uVar2 <= uVar1) break;
    in_stack_ffffffffffffff2c =
         Kernel::Signature::predicateArity(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    uVar1 = local_20;
    in_stack_ffffffffffffff20 =
         (DArray<unsigned_int> *)
         Lib::DArray<unsigned_int>::operator[]
                   ((DArray<unsigned_int> *)(in_RDI + 0x1c),(ulong)local_30);
    *(uint *)&in_stack_ffffffffffffff20->_size = uVar1;
    in_stack_ffffffffffffff10 = (Signature *)std::pow<unsigned_int,unsigned_int>(0,0x2b1780);
    local_20 = (int)(long)(double)in_stack_ffffffffffffff10 + local_20;
    local_30 = local_30 + 1;
  }
  Lib::DArray<unsigned_int>::expand
            ((DArray<unsigned_int> *)CONCAT44(uVar2,uVar1),
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),defVal);
  return;
}

Assistant:

FiniteModel::FiniteModel(unsigned size) : _size(size), _isPartial(false)
{
  (void)_isPartial; // to suppress unused warning

  f_offsets.ensure(env.signature->functions());
  p_offsets.ensure(env.signature->predicates());

  // generate offsets per function for indexing f_interpreation
  // see addFunctionDefinition for how the offset is used to compute
  // the actual index
  unsigned offsets=1;
  for(unsigned f=0; f<env.signature->functions(); f++){
    unsigned arity=env.signature->functionArity(f);
    f_offsets[f]=offsets;
    unsigned add = pow(size,arity+1);
    ASS(UINT_MAX - add > offsets);
    offsets += add;
  }
  f_interpretation.expand(offsets+1,0);
  // can restart for predicates as indexing p_interepration instead
  offsets=1;
  for(unsigned p=1; p<env.signature->predicates();p++){
    unsigned arity=env.signature->predicateArity(p);
    p_offsets[p]=offsets;
    unsigned add = pow(size,arity+1);
    ASS(UINT_MAX - add > offsets);
    offsets += add;
  }
  p_interpretation.expand(offsets+1,0);

}